

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

void __thiscall
cmCPackIFWRepository::WriteRepositoryConfig(cmCPackIFWRepository *this,cmXMLWriter *xout)

{
  cmXMLWriter *pcVar1;
  ulong uVar2;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xout_local;
  cmCPackIFWRepository *this_local;
  
  local_18 = xout;
  xout_local = (cmXMLWriter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Repository",&local_39);
  cmXMLWriter::StartElement(xout,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Url",&local_71);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_70,&this->Url);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  uVar2 = std::__cxx11::string::empty();
  pcVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Enabled",&local_99);
    cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_98,&this->Enabled);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  uVar2 = std::__cxx11::string::empty();
  pcVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Username",&local_c1);
    cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_c0,&this->Username);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  uVar2 = std::__cxx11::string::empty();
  pcVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Password",&local_e9);
    cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_e8,&this->Password);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  uVar2 = std::__cxx11::string::empty();
  pcVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"DisplayName",&local_111);
    cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_110,&this->DisplayName);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  cmXMLWriter::EndElement(local_18);
  return;
}

Assistant:

void cmCPackIFWRepository::WriteRepositoryConfig(cmXMLWriter& xout) const
{
  xout.StartElement("Repository");

  // Url
  xout.Element("Url", this->Url);
  // Enabled
  if (!this->Enabled.empty()) {
    xout.Element("Enabled", this->Enabled);
  }
  // Username
  if (!this->Username.empty()) {
    xout.Element("Username", this->Username);
  }
  // Password
  if (!this->Password.empty()) {
    xout.Element("Password", this->Password);
  }
  // DisplayName
  if (!this->DisplayName.empty()) {
    xout.Element("DisplayName", this->DisplayName);
  }

  xout.EndElement();
}